

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O2

void __thiscall QFileSystemComboBox::setRootPath(QFileSystemComboBox *this,QString *rootPath)

{
  _Optional_payload_base<std::pair<int,_QFileInfo>_> local_20;
  
  local_20._M_engaged = false;
  QFileSystemComboBoxPrivate::setRootPath(this->d,rootPath,(LayoutValue *)&local_20);
  std::_Optional_payload_base<std::pair<int,_QFileInfo>_>::_M_reset(&local_20);
  return;
}

Assistant:

void QFileSystemComboBox::setRootPath(const QString &rootPath) {
    d->setRootPath(rootPath, {});
}